

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

void Sbl_ManWindow(Sbl_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  long lVar6;
  
  p->vLeaves->nSize = 0;
  pGVar3 = p->pGia;
  pVVar4 = pGVar3->vCis;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      iVar1 = pVVar4->pArray[lVar5];
      if ((iVar1 < 0) || (pGVar3->nObjs <= iVar1)) goto LAB_00767902;
      if (iVar1 == 0) break;
      Vec_IntPush(p->vLeaves,iVar1);
      lVar5 = lVar5 + 1;
      pGVar3 = p->pGia;
      pVVar4 = pGVar3->vCis;
    } while (lVar5 < pVVar4->nSize);
  }
  p->vAnds->nSize = 0;
  pGVar3 = p->pGia;
  if (0 < pGVar3->nObjs) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      uVar2 = *(uint *)(&pGVar3->pObjs->field_0x0 + lVar6);
      if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
        Vec_IntPush(p->vAnds,(int)lVar5);
      }
      lVar5 = lVar5 + 1;
      pGVar3 = p->pGia;
      lVar6 = lVar6 + 0xc;
    } while (lVar5 < pGVar3->nObjs);
  }
  p->vRoots->nSize = 0;
  pGVar3 = p->pGia;
  pVVar4 = pGVar3->vCos;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      iVar1 = pVVar4->pArray[lVar5];
      if (((long)iVar1 < 0) || (pGVar3->nObjs <= iVar1)) {
LAB_00767902:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Vec_IntPush(p->vRoots,iVar1 - (*(uint *)(pGVar3->pObjs + iVar1) & 0x1fffffff));
      lVar5 = lVar5 + 1;
      pGVar3 = p->pGia;
      pVVar4 = pGVar3->vCos;
    } while (lVar5 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Sbl_ManWindow( Sbl_Man_t * p )
{
    int i, ObjId;
    // collect leaves
    Vec_IntClear( p->vLeaves );
    Gia_ManForEachCiId( p->pGia, ObjId, i )
        Vec_IntPush( p->vLeaves, ObjId );
    // collect internal
    Vec_IntClear( p->vAnds );
    Gia_ManForEachAndId( p->pGia, ObjId )
        Vec_IntPush( p->vAnds, ObjId );
    // collect roots
    Vec_IntClear( p->vRoots );
    Gia_ManForEachCoDriverId( p->pGia, ObjId, i )
        Vec_IntPush( p->vRoots, ObjId );
}